

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzprism.cpp
# Opt level: O0

void pztopology::TPZPrism::ComputeHDivDirections<double>
               (TPZFMatrix<double> *gradx,TPZFMatrix<double> *directions)

{
  _func_int **pp_Var1;
  double *pdVar2;
  double dVar3;
  double dVar4;
  int iv;
  int i_2;
  int i_1;
  TPZManVector<double,_3> NormalScales;
  double Nv3vdiag;
  double Nv3v1;
  double Nv2v3;
  double Nv1v2;
  int i;
  TPZManVector<double,_3> v3vdiag;
  TPZManVector<double,_3> vdiag;
  TPZManVector<double,_3> vec3;
  TPZManVector<double,_3> vec2;
  TPZManVector<double,_3> vec1;
  TPZManVector<double,_3> v2v3;
  TPZManVector<double,_3> v3v1;
  TPZManVector<double,_3> v1v2;
  TPZManVector<double,_3> v3;
  TPZManVector<double,_3> v2;
  TPZManVector<double,_3> v1;
  double detjac;
  TPZManVector<double,_3> *in_stack_fffffffffffff3e0;
  TPZVec<double> *in_stack_fffffffffffff3f0;
  double *in_stack_fffffffffffff3f8;
  TPZFMatrix<double> *in_stack_fffffffffffff400;
  int64_t in_stack_fffffffffffff408;
  TPZManVector<double,_3> *in_stack_fffffffffffff410;
  TPZVec<double> *in_stack_fffffffffffff418;
  TPZVec<double> *in_stack_fffffffffffff420;
  TPZFMatrix<double> *in_stack_fffffffffffff500;
  int local_304;
  int local_300;
  int local_2fc;
  TPZVec<double> local_2f0;
  double local_2b8;
  double local_2b0;
  double local_2a8;
  double local_2a0;
  int local_294;
  TPZVec<double> local_258 [12];
  TPZVec<double> local_d0 [2];
  TPZVec<double> local_88;
  TPZVec<double> local_50;
  double local_18;
  
  local_18 = TPZAxesTools<double>::ComputeDetjac(in_stack_fffffffffffff500);
  TPZManVector<double,_3>::TPZManVector
            ((TPZManVector<double,_3> *)in_stack_fffffffffffff400,(int64_t)in_stack_fffffffffffff3f8
            );
  TPZManVector<double,_3>::TPZManVector
            ((TPZManVector<double,_3> *)in_stack_fffffffffffff400,(int64_t)in_stack_fffffffffffff3f8
            );
  TPZManVector<double,_3>::TPZManVector
            ((TPZManVector<double,_3> *)in_stack_fffffffffffff400,(int64_t)in_stack_fffffffffffff3f8
            );
  TPZManVector<double,_3>::TPZManVector
            ((TPZManVector<double,_3> *)in_stack_fffffffffffff400,(int64_t)in_stack_fffffffffffff3f8
            );
  TPZManVector<double,_3>::TPZManVector
            ((TPZManVector<double,_3> *)in_stack_fffffffffffff400,(int64_t)in_stack_fffffffffffff3f8
            );
  TPZManVector<double,_3>::TPZManVector
            ((TPZManVector<double,_3> *)in_stack_fffffffffffff400,(int64_t)in_stack_fffffffffffff3f8
            );
  TPZManVector<double,_3>::TPZManVector
            ((TPZManVector<double,_3> *)in_stack_fffffffffffff400,(int64_t)in_stack_fffffffffffff3f8
            );
  TPZManVector<double,_3>::TPZManVector
            ((TPZManVector<double,_3> *)in_stack_fffffffffffff400,(int64_t)in_stack_fffffffffffff3f8
            );
  TPZManVector<double,_3>::TPZManVector
            ((TPZManVector<double,_3> *)in_stack_fffffffffffff400,(int64_t)in_stack_fffffffffffff3f8
            );
  TPZManVector<double,_3>::TPZManVector
            ((TPZManVector<double,_3> *)in_stack_fffffffffffff400,(int64_t)in_stack_fffffffffffff3f8
            );
  TPZManVector<double,_3>::TPZManVector
            ((TPZManVector<double,_3> *)in_stack_fffffffffffff400,(int64_t)in_stack_fffffffffffff3f8
            );
  for (local_294 = 0; local_294 < 3; local_294 = local_294 + 1) {
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff400,(int64_t)in_stack_fffffffffffff3f8,
                        (int64_t)in_stack_fffffffffffff3f0);
    dVar4 = *pdVar2;
    pdVar2 = TPZVec<double>::operator[](&local_50,(long)local_294);
    *pdVar2 = dVar4;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff400,(int64_t)in_stack_fffffffffffff3f8,
                        (int64_t)in_stack_fffffffffffff3f0);
    dVar4 = *pdVar2;
    pdVar2 = TPZVec<double>::operator[](&local_88,(long)local_294);
    *pdVar2 = dVar4;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff400,(int64_t)in_stack_fffffffffffff3f8,
                        (int64_t)in_stack_fffffffffffff3f0);
    dVar4 = *pdVar2;
    pdVar2 = TPZVec<double>::operator[](local_d0,(long)local_294);
    *pdVar2 = dVar4;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff400,(int64_t)in_stack_fffffffffffff3f8,
                        (int64_t)in_stack_fffffffffffff3f0);
    dVar4 = *pdVar2;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff400,(int64_t)in_stack_fffffffffffff3f8,
                        (int64_t)in_stack_fffffffffffff3f0);
    dVar3 = *pdVar2;
    pdVar2 = TPZVec<double>::operator[](local_258,(long)local_294);
    *pdVar2 = dVar4 - dVar3;
  }
  TPZNumeric::ProdVetorial<double>
            (in_stack_fffffffffffff420,in_stack_fffffffffffff418,
             &in_stack_fffffffffffff410->super_TPZVec<double>);
  TPZNumeric::ProdVetorial<double>
            (in_stack_fffffffffffff420,in_stack_fffffffffffff418,
             &in_stack_fffffffffffff410->super_TPZVec<double>);
  TPZNumeric::ProdVetorial<double>
            (in_stack_fffffffffffff420,in_stack_fffffffffffff418,
             &in_stack_fffffffffffff410->super_TPZVec<double>);
  TPZNumeric::ProdVetorial<double>
            (in_stack_fffffffffffff420,in_stack_fffffffffffff418,
             &in_stack_fffffffffffff410->super_TPZVec<double>);
  local_2a0 = TPZNumeric::Norm<double>(in_stack_fffffffffffff3f0);
  local_2a8 = TPZNumeric::Norm<double>(in_stack_fffffffffffff3f0);
  local_2b0 = TPZNumeric::Norm<double>(in_stack_fffffffffffff3f0);
  local_2b8 = TPZNumeric::Norm<double>(in_stack_fffffffffffff3f0);
  TPZManVector<double,_3>::TPZManVector
            (in_stack_fffffffffffff410,in_stack_fffffffffffff408,(double *)in_stack_fffffffffffff400
            );
  local_2a0 = 1.0;
  local_2a8 = 2.0;
  local_2b0 = 2.0;
  local_2b8 = 2.0;
  for (local_2fc = 0; dVar4 = local_18, local_2fc < 3; local_2fc = local_2fc + 1) {
    pdVar2 = TPZVec<double>::operator[](&local_50,(long)local_2fc);
    dVar3 = local_18;
    *pdVar2 = *pdVar2 / dVar4;
    pdVar2 = TPZVec<double>::operator[](&local_88,(long)local_2fc);
    dVar4 = local_18;
    *pdVar2 = *pdVar2 / dVar3;
    pdVar2 = TPZVec<double>::operator[](local_d0,(long)local_2fc);
    *pdVar2 = *pdVar2 / dVar4;
  }
  for (local_300 = 0; local_300 < 3; local_300 = local_300 + 1) {
    for (local_304 = 0; local_304 < 7; local_304 = local_304 + 1) {
      pdVar2 = TPZVec<double>::operator[](local_d0,(long)local_300);
      dVar4 = *pdVar2;
      pdVar2 = TPZVec<double>::operator[](&local_2f0,0);
      dVar3 = *pdVar2;
      pdVar2 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffff400,(int64_t)in_stack_fffffffffffff3f8,
                          (int64_t)in_stack_fffffffffffff3f0);
      *pdVar2 = -dVar4 * dVar3 * 6.0;
      pdVar2 = TPZVec<double>::operator[](local_d0,(long)local_300);
      dVar4 = *pdVar2;
      pdVar2 = TPZVec<double>::operator[](&local_2f0,0);
      dVar3 = *pdVar2;
      pdVar2 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffff400,(int64_t)in_stack_fffffffffffff3f8,
                          (int64_t)in_stack_fffffffffffff3f0);
      *pdVar2 = dVar4 * dVar3 * 6.0;
    }
    pdVar2 = TPZVec<double>::operator[](&local_88,(long)local_300);
    dVar3 = -*pdVar2 * local_2b0;
    pdVar2 = TPZVec<double>::operator[](&local_2f0,2);
    dVar4 = *pdVar2;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff400,(int64_t)in_stack_fffffffffffff3f8,
                        (int64_t)in_stack_fffffffffffff3f0);
    *pdVar2 = dVar3 * dVar4;
    pdVar2 = TPZVec<double>::operator[](&local_50,(long)local_300);
    dVar4 = *pdVar2;
    pdVar2 = TPZVec<double>::operator[](&local_88,(long)local_300);
    dVar3 = (dVar4 - *pdVar2) * local_2b0;
    pdVar2 = TPZVec<double>::operator[](&local_2f0,2);
    dVar4 = *pdVar2;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff400,(int64_t)in_stack_fffffffffffff3f8,
                        (int64_t)in_stack_fffffffffffff3f0);
    *pdVar2 = dVar3 * dVar4;
    pdVar2 = TPZVec<double>::operator[](&local_50,(long)local_300);
    dVar4 = *pdVar2;
    pdVar2 = TPZVec<double>::operator[](&local_88,(long)local_300);
    dVar3 = (dVar4 - *pdVar2) * local_2b0;
    pdVar2 = TPZVec<double>::operator[](&local_2f0,2);
    dVar4 = *pdVar2;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff400,(int64_t)in_stack_fffffffffffff3f8,
                        (int64_t)in_stack_fffffffffffff3f0);
    *pdVar2 = dVar3 * dVar4;
    pdVar2 = TPZVec<double>::operator[](&local_88,(long)local_300);
    dVar3 = -*pdVar2 * local_2b0;
    pdVar2 = TPZVec<double>::operator[](&local_2f0,2);
    dVar4 = *pdVar2;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff400,(int64_t)in_stack_fffffffffffff3f8,
                        (int64_t)in_stack_fffffffffffff3f0);
    *pdVar2 = dVar3 * dVar4;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff400,(int64_t)in_stack_fffffffffffff3f8,
                        (int64_t)in_stack_fffffffffffff3f0);
    dVar4 = *pdVar2;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff400,(int64_t)in_stack_fffffffffffff3f8,
                        (int64_t)in_stack_fffffffffffff3f0);
    dVar3 = *pdVar2;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff400,(int64_t)in_stack_fffffffffffff3f8,
                        (int64_t)in_stack_fffffffffffff3f0);
    *pdVar2 = (dVar4 + dVar3) * 0.5;
    pdVar2 = TPZVec<double>::operator[](&local_50,(long)local_300);
    dVar4 = *pdVar2;
    pdVar2 = TPZVec<double>::operator[](&local_88,(long)local_300);
    dVar3 = (dVar4 - *pdVar2) * local_2b0;
    pdVar2 = TPZVec<double>::operator[](&local_2f0,2);
    dVar4 = *pdVar2;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff400,(int64_t)in_stack_fffffffffffff3f8,
                        (int64_t)in_stack_fffffffffffff3f0);
    *pdVar2 = dVar3 * dVar4;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff400,(int64_t)in_stack_fffffffffffff3f8,
                        (int64_t)in_stack_fffffffffffff3f0);
    dVar4 = *pdVar2;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff400,(int64_t)in_stack_fffffffffffff3f8,
                        (int64_t)in_stack_fffffffffffff3f0);
    dVar3 = *pdVar2;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff400,(int64_t)in_stack_fffffffffffff3f8,
                        (int64_t)in_stack_fffffffffffff3f0);
    *pdVar2 = (dVar4 + dVar3) * 0.5;
    pdVar2 = TPZVec<double>::operator[](&local_88,(long)local_300);
    dVar3 = -*pdVar2 * local_2b0;
    pdVar2 = TPZVec<double>::operator[](&local_2f0,2);
    dVar4 = *pdVar2;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff400,(int64_t)in_stack_fffffffffffff3f8,
                        (int64_t)in_stack_fffffffffffff3f0);
    *pdVar2 = dVar3 * dVar4;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff400,(int64_t)in_stack_fffffffffffff3f8,
                        (int64_t)in_stack_fffffffffffff3f0);
    dVar4 = *pdVar2;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff400,(int64_t)in_stack_fffffffffffff3f8,
                        (int64_t)in_stack_fffffffffffff3f0);
    dVar3 = *pdVar2;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff400,(int64_t)in_stack_fffffffffffff3f8,
                        (int64_t)in_stack_fffffffffffff3f0);
    *pdVar2 = (dVar4 + dVar3) * 0.5;
    pdVar2 = TPZVec<double>::operator[](&local_50,(long)local_300);
    dVar3 = *pdVar2 * local_2b8;
    pdVar2 = TPZVec<double>::operator[](&local_2f0,3);
    dVar4 = *pdVar2;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff400,(int64_t)in_stack_fffffffffffff3f8,
                        (int64_t)in_stack_fffffffffffff3f0);
    *pdVar2 = dVar3 * dVar4;
    pdVar2 = TPZVec<double>::operator[](&local_88,(long)local_300);
    dVar3 = *pdVar2 * local_2b8;
    pdVar2 = TPZVec<double>::operator[](&local_2f0,3);
    dVar4 = *pdVar2;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff400,(int64_t)in_stack_fffffffffffff3f8,
                        (int64_t)in_stack_fffffffffffff3f0);
    *pdVar2 = dVar3 * dVar4;
    pdVar2 = TPZVec<double>::operator[](&local_88,(long)local_300);
    dVar3 = *pdVar2 * local_2b8;
    pdVar2 = TPZVec<double>::operator[](&local_2f0,3);
    dVar4 = *pdVar2;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff400,(int64_t)in_stack_fffffffffffff3f8,
                        (int64_t)in_stack_fffffffffffff3f0);
    *pdVar2 = dVar3 * dVar4;
    pdVar2 = TPZVec<double>::operator[](&local_50,(long)local_300);
    dVar3 = *pdVar2 * local_2b8;
    pdVar2 = TPZVec<double>::operator[](&local_2f0,3);
    dVar4 = *pdVar2;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff400,(int64_t)in_stack_fffffffffffff3f8,
                        (int64_t)in_stack_fffffffffffff3f0);
    *pdVar2 = dVar3 * dVar4;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff400,(int64_t)in_stack_fffffffffffff3f8,
                        (int64_t)in_stack_fffffffffffff3f0);
    dVar4 = *pdVar2;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff400,(int64_t)in_stack_fffffffffffff3f8,
                        (int64_t)in_stack_fffffffffffff3f0);
    dVar3 = *pdVar2;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff400,(int64_t)in_stack_fffffffffffff3f8,
                        (int64_t)in_stack_fffffffffffff3f0);
    *pdVar2 = (dVar4 + dVar3) * 0.5;
    pdVar2 = TPZVec<double>::operator[](&local_88,(long)local_300);
    dVar3 = *pdVar2 * local_2b8;
    pdVar2 = TPZVec<double>::operator[](&local_2f0,3);
    dVar4 = *pdVar2;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff400,(int64_t)in_stack_fffffffffffff3f8,
                        (int64_t)in_stack_fffffffffffff3f0);
    *pdVar2 = dVar3 * dVar4;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff400,(int64_t)in_stack_fffffffffffff3f8,
                        (int64_t)in_stack_fffffffffffff3f0);
    dVar4 = *pdVar2;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff400,(int64_t)in_stack_fffffffffffff3f8,
                        (int64_t)in_stack_fffffffffffff3f0);
    dVar3 = *pdVar2;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff400,(int64_t)in_stack_fffffffffffff3f8,
                        (int64_t)in_stack_fffffffffffff3f0);
    *pdVar2 = (dVar4 + dVar3) * 0.5;
    pdVar2 = TPZVec<double>::operator[](&local_50,(long)local_300);
    dVar3 = *pdVar2 * local_2b8;
    pdVar2 = TPZVec<double>::operator[](&local_2f0,3);
    dVar4 = *pdVar2;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff400,(int64_t)in_stack_fffffffffffff3f8,
                        (int64_t)in_stack_fffffffffffff3f0);
    *pdVar2 = dVar3 * dVar4;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff400,(int64_t)in_stack_fffffffffffff3f8,
                        (int64_t)in_stack_fffffffffffff3f0);
    dVar4 = *pdVar2;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff400,(int64_t)in_stack_fffffffffffff3f8,
                        (int64_t)in_stack_fffffffffffff3f0);
    dVar3 = *pdVar2;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff400,(int64_t)in_stack_fffffffffffff3f8,
                        (int64_t)in_stack_fffffffffffff3f0);
    *pdVar2 = (dVar4 + dVar3) * 0.5;
    pdVar2 = TPZVec<double>::operator[](&local_50,(long)local_300);
    dVar3 = -*pdVar2 * local_2a8;
    pdVar2 = TPZVec<double>::operator[](&local_2f0,1);
    dVar4 = *pdVar2;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff400,(int64_t)in_stack_fffffffffffff3f8,
                        (int64_t)in_stack_fffffffffffff3f0);
    *pdVar2 = dVar3 * dVar4;
    pdVar2 = TPZVec<double>::operator[](&local_88,(long)local_300);
    dVar4 = *pdVar2;
    pdVar2 = TPZVec<double>::operator[](&local_50,(long)local_300);
    dVar3 = (dVar4 - *pdVar2) * local_2a8;
    pdVar2 = TPZVec<double>::operator[](&local_2f0,1);
    dVar4 = *pdVar2;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff400,(int64_t)in_stack_fffffffffffff3f8,
                        (int64_t)in_stack_fffffffffffff3f0);
    *pdVar2 = dVar3 * dVar4;
    pdVar2 = TPZVec<double>::operator[](&local_88,(long)local_300);
    dVar4 = *pdVar2;
    pdVar2 = TPZVec<double>::operator[](&local_50,(long)local_300);
    dVar3 = (dVar4 - *pdVar2) * local_2a8;
    pdVar2 = TPZVec<double>::operator[](&local_2f0,1);
    dVar4 = *pdVar2;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff400,(int64_t)in_stack_fffffffffffff3f8,
                        (int64_t)in_stack_fffffffffffff3f0);
    *pdVar2 = dVar3 * dVar4;
    pdVar2 = TPZVec<double>::operator[](&local_50,(long)local_300);
    dVar3 = -*pdVar2 * local_2a8;
    pdVar2 = TPZVec<double>::operator[](&local_2f0,1);
    dVar4 = *pdVar2;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff400,(int64_t)in_stack_fffffffffffff3f8,
                        (int64_t)in_stack_fffffffffffff3f0);
    *pdVar2 = dVar3 * dVar4;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff400,(int64_t)in_stack_fffffffffffff3f8,
                        (int64_t)in_stack_fffffffffffff3f0);
    dVar4 = *pdVar2;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff400,(int64_t)in_stack_fffffffffffff3f8,
                        (int64_t)in_stack_fffffffffffff3f0);
    dVar3 = *pdVar2;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff400,(int64_t)in_stack_fffffffffffff3f8,
                        (int64_t)in_stack_fffffffffffff3f0);
    *pdVar2 = (dVar4 + dVar3) * 0.5;
    pdVar2 = TPZVec<double>::operator[](&local_88,(long)local_300);
    dVar4 = *pdVar2;
    pdVar2 = TPZVec<double>::operator[](&local_50,(long)local_300);
    dVar3 = (dVar4 - *pdVar2) * local_2a8;
    pdVar2 = TPZVec<double>::operator[](&local_2f0,1);
    dVar4 = *pdVar2;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff400,(int64_t)in_stack_fffffffffffff3f8,
                        (int64_t)in_stack_fffffffffffff3f0);
    *pdVar2 = dVar3 * dVar4;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff400,(int64_t)in_stack_fffffffffffff3f8,
                        (int64_t)in_stack_fffffffffffff3f0);
    dVar4 = *pdVar2;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff400,(int64_t)in_stack_fffffffffffff3f8,
                        (int64_t)in_stack_fffffffffffff3f0);
    dVar3 = *pdVar2;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff400,(int64_t)in_stack_fffffffffffff3f8,
                        (int64_t)in_stack_fffffffffffff3f0);
    *pdVar2 = (dVar4 + dVar3) * 0.5;
    pdVar2 = TPZVec<double>::operator[](&local_50,(long)local_300);
    dVar3 = -*pdVar2 * local_2a8;
    pdVar2 = TPZVec<double>::operator[](&local_2f0,1);
    dVar4 = *pdVar2;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff400,(int64_t)in_stack_fffffffffffff3f8,
                        (int64_t)in_stack_fffffffffffff3f0);
    *pdVar2 = dVar3 * dVar4;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff400,(int64_t)in_stack_fffffffffffff3f8,
                        (int64_t)in_stack_fffffffffffff3f0);
    dVar4 = *pdVar2;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff400,(int64_t)in_stack_fffffffffffff3f8,
                        (int64_t)in_stack_fffffffffffff3f0);
    dVar3 = *pdVar2;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff400,(int64_t)in_stack_fffffffffffff3f8,
                        (int64_t)in_stack_fffffffffffff3f0);
    *pdVar2 = (dVar4 + dVar3) * 0.5;
    pdVar2 = TPZVec<double>::operator[](&local_50,(long)local_300);
    dVar3 = *pdVar2 * local_2a8;
    pdVar2 = TPZVec<double>::operator[](&local_2f0,1);
    dVar4 = *pdVar2;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff400,(int64_t)in_stack_fffffffffffff3f8,
                        (int64_t)in_stack_fffffffffffff3f0);
    *pdVar2 = dVar3 * dVar4;
    pdVar2 = TPZVec<double>::operator[](&local_88,(long)local_300);
    dVar4 = *pdVar2;
    pdVar2 = TPZVec<double>::operator[](&local_50,(long)local_300);
    dVar3 = *pdVar2;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff400,(int64_t)in_stack_fffffffffffff3f8,
                        (int64_t)in_stack_fffffffffffff3f0);
    *pdVar2 = (dVar4 - dVar3) * 0.5;
    pdVar2 = TPZVec<double>::operator[](&local_88,(long)local_300);
    dVar3 = -*pdVar2 * local_2b0;
    pdVar2 = TPZVec<double>::operator[](&local_2f0,2);
    dVar4 = *pdVar2;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff400,(int64_t)in_stack_fffffffffffff3f8,
                        (int64_t)in_stack_fffffffffffff3f0);
    *pdVar2 = dVar3 * dVar4;
    pdVar2 = TPZVec<double>::operator[](local_d0,(long)local_300);
    dVar3 = *pdVar2 * local_2a0;
    pdVar2 = TPZVec<double>::operator[](&local_2f0,0);
    dVar4 = *pdVar2;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff400,(int64_t)in_stack_fffffffffffff3f8,
                        (int64_t)in_stack_fffffffffffff3f0);
    *pdVar2 = dVar3 * dVar4;
    pdVar2 = TPZVec<double>::operator[](local_d0,(long)local_300);
    dVar3 = *pdVar2 * local_2a0;
    pdVar2 = TPZVec<double>::operator[](&local_2f0,0);
    dVar4 = *pdVar2;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff400,(int64_t)in_stack_fffffffffffff3f8,
                        (int64_t)in_stack_fffffffffffff3f0);
    *pdVar2 = dVar3 * dVar4;
    pdVar2 = TPZVec<double>::operator[](local_d0,(long)local_300);
    dVar3 = *pdVar2 * local_2a0;
    pdVar2 = TPZVec<double>::operator[](&local_2f0,0);
    dVar4 = *pdVar2;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff400,(int64_t)in_stack_fffffffffffff3f8,
                        (int64_t)in_stack_fffffffffffff3f0);
    *pdVar2 = dVar3 * dVar4;
    pdVar2 = TPZVec<double>::operator[](&local_50,(long)local_300);
    dVar3 = *pdVar2 * local_2a8;
    pdVar2 = TPZVec<double>::operator[](&local_2f0,1);
    dVar4 = *pdVar2;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff400,(int64_t)in_stack_fffffffffffff3f8,
                        (int64_t)in_stack_fffffffffffff3f0);
    *pdVar2 = dVar3 * dVar4;
    pdVar2 = TPZVec<double>::operator[](&local_88,(long)local_300);
    dVar4 = *pdVar2;
    pdVar2 = TPZVec<double>::operator[](&local_50,(long)local_300);
    dVar3 = *pdVar2;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff400,(int64_t)in_stack_fffffffffffff3f8,
                        (int64_t)in_stack_fffffffffffff3f0);
    *pdVar2 = (dVar4 - dVar3) * 0.5;
    pdVar2 = TPZVec<double>::operator[](&local_88,(long)local_300);
    dVar3 = -*pdVar2 * local_2b0;
    pdVar2 = TPZVec<double>::operator[](&local_2f0,2);
    dVar4 = *pdVar2;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff400,(int64_t)in_stack_fffffffffffff3f8,
                        (int64_t)in_stack_fffffffffffff3f0);
    *pdVar2 = dVar3 * dVar4;
    pdVar2 = TPZVec<double>::operator[](&local_50,(long)local_300);
    dVar3 = *pdVar2 * local_2a8;
    pdVar2 = TPZVec<double>::operator[](&local_2f0,1);
    dVar4 = *pdVar2;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff400,(int64_t)in_stack_fffffffffffff3f8,
                        (int64_t)in_stack_fffffffffffff3f0);
    *pdVar2 = dVar3 * dVar4;
    pdVar2 = TPZVec<double>::operator[](&local_88,(long)local_300);
    dVar3 = *pdVar2 * local_2b0;
    pdVar2 = TPZVec<double>::operator[](&local_2f0,2);
    dVar4 = *pdVar2;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff400,(int64_t)in_stack_fffffffffffff3f8,
                        (int64_t)in_stack_fffffffffffff3f0);
    *pdVar2 = dVar3 * dVar4;
    pdVar2 = TPZVec<double>::operator[](&local_50,(long)local_300);
    dVar3 = *pdVar2 * local_2a8;
    pdVar2 = TPZVec<double>::operator[](&local_2f0,1);
    dVar4 = *pdVar2;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff400,(int64_t)in_stack_fffffffffffff3f8,
                        (int64_t)in_stack_fffffffffffff3f0);
    *pdVar2 = dVar3 * dVar4 * 0.5;
    pdVar2 = TPZVec<double>::operator[](local_d0,(long)local_300);
    dVar3 = *pdVar2 * local_2a0;
    pdVar2 = TPZVec<double>::operator[](&local_2f0,0);
    dVar4 = *pdVar2;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff400,(int64_t)in_stack_fffffffffffff3f8,
                        (int64_t)in_stack_fffffffffffff3f0);
    *pdVar2 = dVar3 * dVar4;
    pdVar2 = TPZVec<double>::operator[](&local_88,(long)local_300);
    dVar4 = *pdVar2;
    pdVar2 = TPZVec<double>::operator[](&local_50,(long)local_300);
    dVar3 = *pdVar2;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff400,(int64_t)in_stack_fffffffffffff3f8,
                        (int64_t)in_stack_fffffffffffff3f0);
    *pdVar2 = (dVar4 - dVar3) * 0.5;
    pdVar2 = TPZVec<double>::operator[](local_d0,(long)local_300);
    dVar3 = *pdVar2 * local_2a0;
    pdVar2 = TPZVec<double>::operator[](&local_2f0,0);
    dVar4 = *pdVar2;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff400,(int64_t)in_stack_fffffffffffff3f8,
                        (int64_t)in_stack_fffffffffffff3f0);
    *pdVar2 = dVar3 * dVar4;
    pdVar2 = TPZVec<double>::operator[](&local_88,(long)local_300);
    dVar3 = *pdVar2 * local_2b0;
    pdVar2 = TPZVec<double>::operator[](&local_2f0,2);
    dVar4 = *pdVar2;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff400,(int64_t)in_stack_fffffffffffff3f8,
                        (int64_t)in_stack_fffffffffffff3f0);
    *pdVar2 = dVar3 * dVar4 * 0.5;
    pdVar2 = TPZVec<double>::operator[](local_d0,(long)local_300);
    dVar3 = *pdVar2 * local_2a0;
    pdVar2 = TPZVec<double>::operator[](&local_2f0,0);
    dVar4 = *pdVar2;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff400,(int64_t)in_stack_fffffffffffff3f8,
                        (int64_t)in_stack_fffffffffffff3f0);
    *pdVar2 = dVar3 * dVar4;
    pdVar2 = TPZVec<double>::operator[](&local_50,(long)local_300);
    dVar3 = *pdVar2 * local_2a8;
    pdVar2 = TPZVec<double>::operator[](&local_2f0,1);
    dVar4 = *pdVar2;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff400,(int64_t)in_stack_fffffffffffff3f8,
                        (int64_t)in_stack_fffffffffffff3f0);
    *pdVar2 = dVar3 * dVar4;
    pdVar2 = TPZVec<double>::operator[](&local_88,(long)local_300);
    dVar3 = *pdVar2 * local_2b0;
    pdVar2 = TPZVec<double>::operator[](&local_2f0,2);
    dVar4 = *pdVar2;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff400,(int64_t)in_stack_fffffffffffff3f8,
                        (int64_t)in_stack_fffffffffffff3f0);
    *pdVar2 = dVar3 * dVar4;
    pdVar2 = TPZVec<double>::operator[](&local_50,(long)local_300);
    dVar3 = *pdVar2 * local_2a8;
    pdVar2 = TPZVec<double>::operator[](&local_2f0,1);
    dVar4 = *pdVar2;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff400,(int64_t)in_stack_fffffffffffff3f8,
                        (int64_t)in_stack_fffffffffffff3f0);
    *pdVar2 = dVar3 * dVar4;
    pdVar2 = TPZVec<double>::operator[](&local_88,(long)local_300);
    dVar4 = *pdVar2 * local_2b0;
    pdVar2 = TPZVec<double>::operator[](&local_2f0,2);
    in_stack_fffffffffffff400 = (TPZFMatrix<double> *)(dVar4 * *pdVar2);
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff400,(int64_t)in_stack_fffffffffffff3f8,
                        (int64_t)in_stack_fffffffffffff3f0);
    *pdVar2 = (double)in_stack_fffffffffffff400;
    in_stack_fffffffffffff3f8 = TPZVec<double>::operator[](local_d0,(long)local_300);
    dVar4 = *in_stack_fffffffffffff3f8 * local_2a0;
    in_stack_fffffffffffff3f0 = (TPZVec<double> *)TPZVec<double>::operator[](&local_2f0,0);
    pp_Var1 = in_stack_fffffffffffff3f0->_vptr_TPZVec;
    in_stack_fffffffffffff3e0 =
         (TPZManVector<double,_3> *)
         TPZFMatrix<double>::operator()
                   (in_stack_fffffffffffff400,(int64_t)in_stack_fffffffffffff3f8,
                    (int64_t)in_stack_fffffffffffff3f0);
    (in_stack_fffffffffffff3e0->super_TPZVec<double>)._vptr_TPZVec =
         (_func_int **)(dVar4 * (double)pp_Var1);
  }
  TPZManVector<double,_3>::~TPZManVector(in_stack_fffffffffffff3e0);
  TPZManVector<double,_3>::~TPZManVector(in_stack_fffffffffffff3e0);
  TPZManVector<double,_3>::~TPZManVector(in_stack_fffffffffffff3e0);
  TPZManVector<double,_3>::~TPZManVector(in_stack_fffffffffffff3e0);
  TPZManVector<double,_3>::~TPZManVector(in_stack_fffffffffffff3e0);
  TPZManVector<double,_3>::~TPZManVector(in_stack_fffffffffffff3e0);
  TPZManVector<double,_3>::~TPZManVector(in_stack_fffffffffffff3e0);
  TPZManVector<double,_3>::~TPZManVector(in_stack_fffffffffffff3e0);
  TPZManVector<double,_3>::~TPZManVector(in_stack_fffffffffffff3e0);
  TPZManVector<double,_3>::~TPZManVector(in_stack_fffffffffffff3e0);
  TPZManVector<double,_3>::~TPZManVector(in_stack_fffffffffffff3e0);
  TPZManVector<double,_3>::~TPZManVector(in_stack_fffffffffffff3e0);
  return;
}

Assistant:

void TPZPrism::ComputeHDivDirections(TPZFMatrix<TVar> &gradx, TPZFMatrix<TVar> &directions)
    {
        TVar detjac = TPZAxesTools<TVar>::ComputeDetjac(gradx);
        
        TPZManVector<TVar,3> v1(3),v2(3),v3(3),v1v2(3),v3v1(3),v2v3(3),vec1(3),vec2(3),vec3(3), vdiag(3), v3vdiag(3);
        for (int i=0; i<3; i++) {
            v1[i] = gradx(i,0);
            v2[i] = gradx(i,1);
            v3[i] = gradx(i,2);
            vdiag[i] = (gradx(i,0)-gradx(i,1));
        }

        
        TPZNumeric::ProdVetorial(v1,v2,v1v2);
        TPZNumeric::ProdVetorial(v2,v3,v2v3);
        TPZNumeric::ProdVetorial(v3,v1,v3v1);
        TPZNumeric::ProdVetorial(v3,vdiag,v3vdiag);
        
        TVar Nv1v2 = TPZNumeric::Norm(v1v2);
        TVar Nv2v3 = TPZNumeric::Norm(v2v3);
        TVar Nv3v1 = TPZNumeric::Norm(v3v1);
        TVar Nv3vdiag = TPZNumeric::Norm(v3vdiag);
        
        /**
         * @file
         * @brief Computing mapped vector with scaling factor equal 1.0.
         * using contravariant piola mapping.
         */
        TPZManVector<TVar,3> NormalScales(4,1.);
        
        
        {
            Nv1v2 = 1.;
            Nv2v3 = 2.;
            Nv3v1 = 2.;
            Nv3vdiag = 2.;
        }
        
        
        for (int i=0; i<3; i++) {
            v1[i] /= detjac;
            v2[i] /= detjac;
            v3[i] /= detjac;
        }
        for (int i=0; i<3; i++)
        {
            for (int iv=0; iv<7; iv++)
            {
                directions(i,iv) = -v3[i]*NormalScales[0]*6.;
                directions(i,iv+34) = v3[i]*NormalScales[0]*6.;
            }
            //face 1
            directions(i,7) = -v2[i]*Nv3v1*NormalScales[2];
            directions(i,8) = (v1[i]-v2[i])*Nv3v1*NormalScales[2];
            directions(i,9) = (v1[i]-v2[i])*Nv3v1*NormalScales[2];
            directions(i,10) = -v2[i]*Nv3v1*NormalScales[2];
            directions(i,11) = ( directions(i,7)+directions(i,8) )/2.;
            directions(i,12) = (v1[i]-v2[i])*Nv3v1*NormalScales[2];
            directions(i,13) = ( directions(i,9)+directions(i,10) )/2.;
            directions(i,14) = -v2[i]*Nv3v1*NormalScales[2];
            directions(i,15) = ( directions(i,12)+directions(i,14) )/2.;
            //face 2
            directions(i,16) = v1[i]*Nv3vdiag*NormalScales[3];
            directions(i,17) = v2[i]*Nv3vdiag*NormalScales[3];
            directions(i,18) = v2[i]*Nv3vdiag*NormalScales[3];
            directions(i,19) = v1[i]*Nv3vdiag*NormalScales[3];
            directions(i,20) = (directions(i,16) + directions(i,17))/2.;
            directions(i,21) = v2[i]*Nv3vdiag*NormalScales[3];
            directions(i,22) = (directions(i,18) + directions(i,19))/2.;
            directions(i,23) = v1[i]*Nv3vdiag*NormalScales[3];
            directions(i,24) = (directions(i,21) + directions(i,23))/2.;
            //face 3
            directions(i,25) = -v1[i]*Nv2v3*NormalScales[1];
            directions(i,26) = (v2[i]-v1[i])*Nv2v3*NormalScales[1];
            directions(i,27) = (v2[i]-v1[i])*Nv2v3*NormalScales[1];
            directions(i,28) = -v1[i]*Nv2v3*NormalScales[1];
            directions(i,29) = ( directions(i,25)+directions(i,26) )/2.;
            directions(i,30) = (v2[i]-v1[i])*Nv2v3*NormalScales[1];
            directions(i,31) = ( directions(i,27)+directions(i,28) )/2.;
            directions(i,32) = -v1[i]*Nv2v3*NormalScales[1];
            directions(i,33) = ( directions(i,30)+directions(i,32) )/2.;
            
            //arestas
            directions(i,41) = v1[i]*Nv2v3*NormalScales[1];//
            directions(i,42) = (v2[i]-v1[i])/2.;//*Nvdiag
            directions(i,43) = -v2[i]*Nv3v1*NormalScales[2];//
            
            directions(i,44) = v3[i]*Nv1v2*NormalScales[0];
            directions(i,45) = v3[i]*Nv1v2*NormalScales[0];
            directions(i,46) = v3[i]*Nv1v2*NormalScales[0];
            
            directions(i,47) = v1[i]*Nv2v3*NormalScales[1];//
            directions(i,48) = (v2[i]-v1[i])/2.;//*Nvdiag
            directions(i,49) = -v2[i]*Nv3v1*NormalScales[2];//
            
            // internal in faces
            directions(i,50) = v1[i]*Nv2v3*NormalScales[1];
            directions(i,51) = v2[i]*Nv3v1*NormalScales[2];
            directions(i,52) = v1[i]*Nv2v3*NormalScales[1]/2.;//
            directions(i,53) = v3[i]*Nv1v2*NormalScales[0];
            directions(i,54) = (v2[i]-v1[i])/2.;//*Nvdiag
            directions(i,55) = v3[i]*Nv1v2*NormalScales[0];
            directions(i,56) = v2[i]*Nv3v1*NormalScales[2]/2.;
            directions(i,57) = v3[i]*Nv1v2*NormalScales[0];
            directions(i,58) = v1[i]*Nv2v3*NormalScales[1];
            directions(i,59) = v2[i]*Nv3v1*NormalScales[2];
            
            
            directions(i,60) = v1[i]*Nv2v3*NormalScales[1];
            directions(i,61) = v2[i]*Nv3v1*NormalScales[2];
            directions(i,62) = v3[i]*Nv1v2*NormalScales[0];
            
        }
        
    }